

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tester.h
# Opt level: O1

void __thiscall
density_tests::
QueueGenericTester<density::lf_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>
::ThreadData::thread_procedure
          (ThreadData *this,size_t i_target_put_count,size_t i_target_consume_count,
          uint64_t i_affinity_mask)

{
  EasyRandom *i_random;
  ulong uVar1;
  reentrant_consume_operation *prVar2;
  reentrant_consume_operation *prVar3;
  result_type_conflict rVar4;
  result_type rVar5;
  char cVar6;
  size_t cycles;
  reentrant_consume_operation *this_00;
  ThreadAllocRandomFailures scoped_alloc_failures;
  ThreadAllocRandomFailures local_49;
  ulong local_48;
  uniform_int_distribution<unsigned_long> local_40;
  
  set_thread_affinity(i_affinity_mask);
  i_random = (EasyRandom *)(this + 0x50);
  ThreadAllocRandomFailures::ThreadAllocRandomFailures(&local_49,i_random,0.03);
  LOCK();
  *(undefined1 *)(*(long *)(this + 0x48) + 0x10) = 1;
  UNLOCK();
  cVar6 = '\0';
  local_48 = 0;
  do {
    uVar1 = *(ulong *)(this + 0x13e0);
    if (uVar1 < i_target_put_count) {
LAB_00cb86dd:
      local_40._M_param._M_a = 0;
      local_40._M_param._M_b = 0xf;
      rVar5 = std::uniform_int_distribution<unsigned_long>::operator()
                        (&local_40,
                         (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                          *)i_random,&local_40._M_param);
      if (rVar5 < (ulong)((*(long *)(this + 0x13f8) - *(long *)(this + 0x13f0) >> 3) *
                         -0x3333333333333333)) {
        handle_pending_put(this,rVar5);
      }
    }
    else {
      if (i_target_consume_count <= *(ulong *)(this + 0x13e8)) {
        **(ulong **)(this + 0x48) = uVar1;
        *(undefined8 *)(*(long *)(this + 0x48) + 8) = *(undefined8 *)(this + 0x13e8);
        prVar2 = *(reentrant_consume_operation **)(this + 0x1408);
        prVar3 = *(reentrant_consume_operation **)(this + 0x1410);
        this_00 = prVar2;
        if (prVar3 != prVar2) {
          do {
            density::
            lf_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
            ::reentrant_consume_operation::~reentrant_consume_operation(this_00);
            this_00 = this_00 + 0x20;
          } while (this_00 != prVar3);
          *(reentrant_consume_operation **)(this + 0x1410) = prVar2;
        }
        std::
        vector<density_tests::QueueGenericTester<density::lf_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>::ThreadData::ReentrantPut,_std::allocator<density_tests::QueueGenericTester<density::lf_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>::ThreadData::ReentrantPut>_>
        ::clear((vector<density_tests::QueueGenericTester<density::lf_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>::ThreadData::ReentrantPut,_std::allocator<density_tests::QueueGenericTester<density::lf_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>::ThreadData::ReentrantPut>_>
                 *)(this + 0x13f0));
        LOCK();
        *(undefined1 *)(*(long *)(this + 0x48) + 0x10) = 0;
        UNLOCK();
        ThreadAllocRandomFailures::~ThreadAllocRandomFailures(&local_49);
        return;
      }
      if (uVar1 < i_target_put_count) goto LAB_00cb86dd;
    }
    if (*(ulong *)(this + 0x13e8) < i_target_consume_count) {
      local_40._M_param._M_a = 0;
      local_40._M_param._M_b = 0xf;
      rVar5 = std::uniform_int_distribution<unsigned_long>::operator()
                        (&local_40,
                         (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                          *)i_random,&local_40._M_param);
      if (rVar5 < (ulong)(*(long *)(this + 0x1410) - *(long *)(this + 0x1408) >> 5)) {
        handle_pending_consume(this,rVar5);
      }
    }
    if (*(ulong *)(this + 0x13e8) < i_target_consume_count &&
        (*(ulong *)(this + 0x13e0) < i_target_put_count && (local_48 & 1) == 0)) {
      local_40._M_param._M_a = 0x100000000;
      rVar4 = std::uniform_int_distribution<int>::operator()
                        ((uniform_int_distribution<int> *)&local_40,
                         (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                          *)i_random,(param_type *)&local_40);
      if (rVar4 == 0) goto LAB_00cb87d6;
LAB_00cb87cc:
      try_consume_one(this);
    }
    else if (*(ulong *)(this + 0x13e0) < i_target_put_count && (local_48 & 1) == 0) {
LAB_00cb87d6:
      put_one(this);
    }
    else {
      if (*(ulong *)(this + 0x13e8) < i_target_consume_count) goto LAB_00cb87cc;
      sched_yield();
    }
    if (cVar6 == '\0') {
      **(undefined8 **)(this + 0x48) = *(undefined8 *)(this + 0x13e0);
      *(undefined8 *)(*(long *)(this + 0x48) + 8) = *(undefined8 *)(this + 0x13e8);
      local_48 = CONCAT71((int7)((ulong)*(undefined1 **)(this + 0x1420) >> 8),
                          **(undefined1 **)(this + 0x1420));
    }
    cVar6 = cVar6 + '\x01';
  } while( true );
}

Assistant:

void thread_procedure(
              size_t const i_target_put_count,
              size_t const i_target_consume_count,
              uint64_t     i_affinity_mask)
            {
                set_thread_affinity(i_affinity_mask);

                ThreadAllocRandomFailures scoped_alloc_failures(m_random, 0.03);

                m_incremental_stats->m_thread_is_active.store(true);

                bool too_many_enqueued = false;

                for (size_t cycles = 0; m_put_committed < i_target_put_count ||
                                        m_consumes_committed < i_target_consume_count;
                     cycles++)
                {
                    // decide between put and consume

                    if (m_put_committed < i_target_put_count)
                    {
                        auto const pending_put_index = m_random.get_int<size_t>(15);
                        if (pending_put_index < m_pending_reentrant_puts.size())
                        {
                            handle_pending_put(pending_put_index);
                        }
                    }

                    if (m_consumes_committed < i_target_consume_count)
                    {
                        auto const pending_consume_index = m_random.get_int<size_t>(15);
                        if (pending_consume_index < m_pending_reentrant_consumes.size())
                        {
                            handle_pending_consume(pending_consume_index);
                        }
                    }

                    bool const can_produce =
                      m_put_committed < i_target_put_count && !too_many_enqueued;
                    bool const can_consume = m_consumes_committed < i_target_consume_count;

                    if (can_produce && can_consume)
                    {
                        if (m_random.get_bool())
                            put_one();
                        else
                            try_consume_one();
                    }
                    else if (can_produce)
                    {
                        put_one();
                    }
                    else if (can_consume)
                    {
                        try_consume_one();
                    }
                    else
                    {
                        std::this_thread::yield();
                    }

                    // update the progress periodically
                    if ((cycles & 255) == 0)
                    {
                        m_incremental_stats->m_produced.store(
                          m_put_committed, std::memory_order_relaxed);
                        m_incremental_stats->m_consumed.store(
                          m_consumes_committed, std::memory_order_relaxed);
                        too_many_enqueued =
                          m_feedback->m_too_many_enqueued.load(std::memory_order_relaxed);
                    }
                }

                m_incremental_stats->m_produced.store(m_put_committed, std::memory_order_relaxed);
                m_incremental_stats->m_consumed.store(
                  m_consumes_committed, std::memory_order_relaxed);

                /* we destroy the pending operation (they get canceled), because otherwise the
                    destructor of the queue would trigger an undefined behavior */
                m_pending_reentrant_consumes.clear();
                m_pending_reentrant_puts.clear();

                // to do: not exception safe
                m_incremental_stats->m_thread_is_active.store(false);
            }